

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::emit_patch_variables(Impl *this)

{
  ExecutionModel EVar1;
  ResourceRemappingInterface *pRVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  ComponentType element_type;
  bool bVar6;
  char cVar7;
  MetadataKind MVar8;
  uint uVar9;
  StorageClass storage;
  uint uVar10;
  uint __val;
  uint rows;
  uint cols;
  uint uVar11;
  uint uVar12;
  Id IVar13;
  Id IVar14;
  MDOperand *pMVar16;
  MDNode *pMVar17;
  Module *module;
  undefined7 extraout_var;
  Builder *this_00;
  MDNode *node;
  mapped_type *pmVar18;
  LoggingCallback p_Var19;
  void *pvVar20;
  byte bVar21;
  ulong in_RCX;
  Decoration decoration;
  uint index;
  bool bVar22;
  BuiltIn builtin;
  Semantic semantic;
  uint element_id;
  String ret;
  String variable_name;
  String semantic_name;
  string __str;
  uint local_10bc;
  undefined8 local_10b8;
  undefined4 local_10b0;
  undefined4 uStack_10ac;
  char local_10a8 [16];
  undefined8 local_1098;
  ulong local_1090;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_1088;
  MDNode *local_1080;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_1078;
  String local_1058;
  uint *local_1038;
  uint uStack_1030;
  uint uStack_102c;
  uint uStack_1028;
  undefined4 uStack_1024;
  undefined5 uStack_1020;
  int iVar15;
  
  pMVar17 = this->entry_point_meta;
  pMVar16 = LLVMBC::MDNode::getOperand(pMVar17,2);
  bVar5 = true;
  if (pMVar16->kind != None) {
    pMVar17 = (MDNode *)LLVMBC::MDNode::getOperand(pMVar17,2);
    MVar8 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)pMVar17);
    if (MVar8 != Node) {
      p_Var19 = get_thread_log_callback();
      if (p_Var19 == (LoggingCallback)0x0) {
        emit_patch_variables();
        std::terminate();
      }
LAB_0011cd9f:
      uStack_1028 = 0x63206e69;
      uStack_1024 = 0x3c747361;
      uStack_1020 = 0xa2e3e54;
      local_1038 = (uint *)0x2064696c61766e49;
      uStack_1030 = 0x65707974;
      uStack_102c = 0x20444920;
      pvVar20 = get_thread_log_callback_userdata();
      (*p_Var19)(pvVar20,Error,(char *)&local_1038);
      std::terminate();
    }
    pMVar17 = (MDNode *)LLVMBC::MDNode::getOperand(pMVar17,2);
    if ((pMVar17->super_MDOperand).kind != None) {
      local_1098 = 0;
      if (this->execution_model == ExecutionModelTessellationControl) {
        module = LLVMBCParser::get_module(this->bitcode_parser);
        bVar5 = module_is_dxilconv(module);
        local_1098 = CONCAT71(extraout_var,bVar5);
      }
      MVar8 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)pMVar17);
      if (MVar8 != Node) {
        pMVar17 = (MDNode *)0x0;
      }
      this_00 = SPIRVModule::get_builder(this->spirv_module);
      EVar1 = this->execution_model;
      uVar9 = LLVMBC::MDNode::getNumOperands(pMVar17);
      bVar5 = uVar9 == 0;
      if (bVar5) {
        uVar9 = 0;
      }
      else {
        storage = (uint)(EVar1 != ExecutionModelTessellationEvaluation) * 2 + StorageClassInput;
        local_1088 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->patch_elements_meta;
        index = 0;
        uVar9 = 0;
        local_1080 = pMVar17;
        do {
          uVar10 = (uint)in_RCX;
          pMVar17 = (MDNode *)LLVMBC::MDNode::getOperand(pMVar17,index);
          MVar8 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)pMVar17);
          if (MVar8 != Node) {
            p_Var19 = get_thread_log_callback();
            if (p_Var19 == (LoggingCallback)0x0) {
              emit_patch_variables();
              std::terminate();
            }
            goto LAB_0011cd9f;
          }
          __val = 0;
          local_10bc = get_constant_metadata<unsigned_int>(pMVar17,0);
          get_string_metadata_abi_cxx11_(&local_1058,(dxil_spv *)pMVar17,(MDNode *)0x1,uVar10);
          uVar10 = get_constant_metadata<unsigned_int>(pMVar17,2);
          bVar21 = (char)uVar10 - 0xb;
          local_1090 = 0xa0a09090808U >> (bVar21 * '\b' & 0x3f) & 0xffffffff;
          if (5 < bVar21) {
            local_1090 = (ulong)uVar10;
          }
          element_type = get_effective_input_output_type(this,(ComponentType)local_1090);
          uVar10 = get_constant_metadata<unsigned_int>(pMVar17,3);
          pMVar16 = LLVMBC::MDNode::getOperand(pMVar17,4);
          if (pMVar16->kind != None) {
            node = (MDNode *)LLVMBC::MDNode::getOperand(pMVar17,4);
            MVar8 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)node);
            if (MVar8 != Node) {
              p_Var19 = get_thread_log_callback();
              if (p_Var19 == (LoggingCallback)0x0) {
                emit_patch_variables();
                std::terminate();
              }
              goto LAB_0011cd9f;
            }
            __val = get_constant_metadata<unsigned_int>(node,0);
          }
          rows = get_constant_metadata<unsigned_int>(pMVar17,6);
          cols = get_constant_metadata<unsigned_int>(pMVar17,7);
          uVar11 = get_constant_metadata<unsigned_int>(pMVar17,8);
          uVar12 = get_constant_metadata<unsigned_int>(pMVar17,9);
          semantic = (Semantic)uVar10;
          if (semantic == InsideTessFactor) {
            rows = 2;
          }
          in_RCX = 4;
          if (semantic == TessFactor) {
            rows = 4;
          }
          bVar22 = (bool)(semantic == User & (byte)local_1098);
          uVar10 = uVar11 + rows;
          if (uVar11 + rows < uVar9) {
            uVar10 = uVar9;
          }
          if (bVar22 != false) {
            uVar9 = uVar10;
          }
          pmVar18 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_1088,&local_10bc);
          if ((byte)(semantic - TessFactor) < 2) {
            builtin = (semantic != TessFactor) + BuiltInTessLevelOuter;
            bVar6 = SPIRVModule::has_builtin_shader_input(this->spirv_module,builtin);
            if (bVar6) {
              (pmVar18->super_ElementMeta).id = 0;
              (pmVar18->super_ElementMeta).component_type = Invalid;
              *(undefined3 *)&(pmVar18->super_ElementMeta).field_0x5 = 0;
              *(undefined8 *)&(pmVar18->super_ElementMeta).semantic_offset = 0;
              *(undefined8 *)((long)&pmVar18->start_row + 1) = 0;
              IVar13 = SPIRVModule::get_builtin_shader_input(this->spirv_module,builtin);
              (pmVar18->super_ElementMeta).id = IVar13;
              (pmVar18->super_ElementMeta).component_type = (ComponentType)local_1090;
              (pmVar18->super_ElementMeta).semantic_offset = uVar11;
            }
            bVar3 = false;
            if (!bVar6) goto LAB_0011c92f;
          }
          else {
LAB_0011c92f:
            if (semantic == CullPrimitive) {
              IVar13 = spv::Builder::makeBoolType(this_00);
            }
            else {
              IVar13 = get_type_id(this,element_type,rows,cols,false);
            }
            if (this->execution_model == ExecutionModelMeshEXT) {
              uVar10 = (this->execution_mode_meta).stage_output_num_primitive;
              IVar14 = spv::Builder::makeIntegerType(this_00,0x20,false);
              IVar14 = spv::Builder::makeIntConstant(this_00,IVar14,uVar10,false);
              IVar13 = spv::Builder::makeArrayType(this_00,IVar13,IVar14,0);
            }
            local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
            std::__cxx11::
            basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                                 *)&local_1078,local_1058._M_dataplus._M_p,
                                local_1058._M_dataplus._M_p + local_1058._M_string_length);
            if (__val != 0) {
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              append(&local_1078,"_");
              cVar7 = '\x01';
              if (9 < __val) {
                uVar10 = __val;
                cVar4 = '\x04';
                do {
                  cVar7 = cVar4;
                  if (uVar10 < 100) {
                    cVar7 = cVar7 + -2;
                    goto LAB_0011ca53;
                  }
                  if (uVar10 < 1000) {
                    cVar7 = cVar7 + -1;
                    goto LAB_0011ca53;
                  }
                  if (uVar10 < 10000) goto LAB_0011ca53;
                  bVar6 = 99999 < uVar10;
                  uVar10 = uVar10 / 10000;
                  cVar4 = cVar7 + '\x04';
                } while (bVar6);
                cVar7 = cVar7 + '\x01';
              }
LAB_0011ca53:
              local_1038 = &uStack_1028;
              std::__cxx11::string::_M_construct((ulong)&local_1038,cVar7);
              std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1038,uStack_1030,__val);
              local_10b8 = local_10a8;
              std::__cxx11::
              basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
              _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                          *)&local_10b8,local_1038,
                         (long)local_1038 + CONCAT44(uStack_102c,uStack_1030));
              if (local_1038 != &uStack_1028) {
                operator_delete(local_1038,CONCAT44(uStack_1024,uStack_1028) + 1);
              }
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              _M_append(&local_1078,local_10b8,CONCAT44(uStack_10ac,local_10b0));
              if (local_10b8 != local_10a8) {
                free_in_thread(local_10b8);
              }
            }
            IVar13 = SPIRVModule::create_variable
                               (this->spirv_module,storage,IVar13,local_1078._M_dataplus._M_p);
            (pmVar18->super_ElementMeta).id = IVar13;
            (pmVar18->super_ElementMeta).component_type = (ComponentType)local_1090;
            (pmVar18->super_ElementMeta).semantic_offset = 0;
            in_RCX = (ulong)uVar11;
            pmVar18->start_row = uVar11;
            pmVar18->start_col = uVar12;
            pmVar18->lowering = bVar22;
            if (semantic == User) {
              local_10b8 = (char *)CONCAT44(uVar12,this->patch_location_offset + uVar11);
              local_10b0 = 1;
              pRVar2 = this->resource_mapping_iface;
              if (pRVar2 == (ResourceRemappingInterface *)0x0) {
LAB_0011cbe6:
                spv::Builder::addDecoration(this_00,IVar13,DecorationLocation,(int)local_10b8);
                if (local_10b8._4_4_ != 0) {
                  spv::Builder::addDecoration(this_00,IVar13,DecorationComponent,local_10b8._4_4_);
                }
                goto LAB_0011cc15;
              }
              local_1038 = (uint *)local_1058._M_dataplus._M_p;
              uStack_1030 = __val;
              uStack_102c = uVar11;
              uStack_1028 = rows;
              if (this->execution_model == ExecutionModelTessellationEvaluation) {
                iVar15 = (*pRVar2->_vptr_ResourceRemappingInterface[8])();
                cVar7 = (char)iVar15;
              }
              else {
                iVar15 = (*pRVar2->_vptr_ResourceRemappingInterface[9])
                                   (pRVar2,&local_1038,&local_10b8);
                cVar7 = (char)iVar15;
              }
              if (cVar7 != '\0') goto LAB_0011cbe6;
              bVar3 = true;
            }
            else {
              emit_builtin_decoration(this,IVar13,semantic,storage);
LAB_0011cc15:
              decoration = DecorationPatch;
              if (this->execution_model == ExecutionModelMeshEXT) {
                decoration = DecorationPerPrimitiveEXT;
              }
              in_RCX = 0xffffffff;
              spv::Builder::addDecoration(this_00,IVar13,decoration,-1);
              bVar3 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
                 *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
              free_in_thread(local_1078._M_dataplus._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
            free_in_thread(local_1058._M_dataplus._M_p);
          }
          pMVar17 = local_1080;
          if (bVar3) {
            return bVar5;
          }
          index = index + 1;
          uVar10 = LLVMBC::MDNode::getNumOperands(local_1080);
          bVar5 = index >= uVar10;
        } while (index < uVar10);
      }
      if (uVar9 != 0) {
        IVar13 = spv::Builder::makeIntegerType(this_00,0x20,false);
        IVar13 = spv::Builder::makeVectorType(this_00,IVar13,4);
        IVar14 = spv::Builder::makeIntegerType(this_00,0x20,false);
        IVar14 = spv::Builder::makeIntConstant(this_00,IVar14,uVar9,false);
        IVar13 = spv::Builder::makeArrayType(this_00,IVar13,IVar14,0);
        IVar14 = spv::Builder::makeNullConstant(this_00,IVar13);
        IVar13 = SPIRVModule::create_variable_with_initializer
                           (this->spirv_module,StorageClassPrivate,IVar13,IVar14,"PatchLoweringRows"
                           );
        (this->execution_mode_meta).patch_lowering_array_var_id = IVar13;
      }
    }
  }
  return bVar5;
}

Assistant:

bool Converter::Impl::emit_patch_variables()
{
	auto *node = entry_point_meta;

	if (!node->getOperand(2))
		return true;

	auto &signature = node->getOperand(2);
	auto *signature_node = llvm::cast<llvm::MDNode>(signature);
	auto &patch_variables = signature_node->getOperand(2);
	if (!patch_variables)
		return true;

	// dxilconv is broken and emits patch the fork phase in a way that is non-sensical.
	// It assumes that you can write outside the bounds of a signature element.
	// To make this work, we need to lower the patch constant variables from Private variables instead.
	bool broken_patch_variables = false;
	if (execution_model == spv::ExecutionModelTessellationControl)
		broken_patch_variables = module_is_dxilconv(bitcode_parser.get_module());

	auto *patch_node = llvm::dyn_cast<llvm::MDNode>(patch_variables);

	auto &builder = spirv_module.get_builder();

	spv::StorageClass storage =
	    execution_model == spv::ExecutionModelTessellationEvaluation ? spv::StorageClassInput : spv::StorageClassOutput;

	unsigned num_broken_user_rows = 0;

	for (unsigned i = 0; i < patch_node->getNumOperands(); i++)
	{
		auto *patch = llvm::cast<llvm::MDNode>(patch_node->getOperand(i));
		auto element_id = get_constant_metadata(patch, 0);
		auto semantic_name = get_string_metadata(patch, 1);
		auto actual_element_type = normalize_component_type(static_cast<DXIL::ComponentType>(get_constant_metadata(patch, 2)));
		auto effective_element_type = get_effective_input_output_type(actual_element_type);
		auto system_value = static_cast<DXIL::Semantic>(get_constant_metadata(patch, 3));

		unsigned semantic_index = 0;
		if (patch->getOperand(4))
			semantic_index = get_constant_metadata(llvm::cast<llvm::MDNode>(patch->getOperand(4)), 0);

		auto rows = get_constant_metadata(patch, 6);
		auto cols = get_constant_metadata(patch, 7);

		auto start_row = get_constant_metadata(patch, 8);
		auto start_col = get_constant_metadata(patch, 9);

		if (system_value == DXIL::Semantic::TessFactor)
			rows = 4;
		else if (system_value == DXIL::Semantic::InsideTessFactor)
			rows = 2;

		if (broken_patch_variables && system_value == DXIL::Semantic::User)
			num_broken_user_rows = std::max<unsigned>(num_broken_user_rows, start_row + rows);

		auto &meta = patch_elements_meta[element_id];

		// Handle case where shader declares the tess factors twice at different offsets.
		unsigned semantic_offset = 0;
		if (system_value == DXIL::Semantic::TessFactor || system_value == DXIL::Semantic::InsideTessFactor)
		{
			auto builtin = system_value == DXIL::Semantic::TessFactor ?
			               spv::BuiltInTessLevelOuter : spv::BuiltInTessLevelInner;
			if (spirv_module.has_builtin_shader_input(builtin))
			{
				meta = {};
				meta.id = spirv_module.get_builtin_shader_input(builtin);
				meta.component_type = actual_element_type;
				meta.semantic_offset = start_row;
				continue;
			}
		}

		spv::Id type_id;

		if (system_value == DXIL::Semantic::CullPrimitive)
			type_id = builder.makeBoolType();
		else
			type_id = get_type_id(effective_element_type, rows, cols);

		if (execution_model == spv::ExecutionModelMeshEXT)
		{
			type_id = builder.makeArrayType(
				type_id, builder.makeUintConstant(execution_mode_meta.stage_output_num_primitive, false), 0);
		}

		auto variable_name = semantic_name;
		if (semantic_index != 0)
		{
			variable_name += "_";
			variable_name += dxil_spv::to_string(semantic_index);
		}

		spv::Id variable_id = create_variable(storage, type_id, variable_name.c_str());
		meta.id = variable_id;
		meta.component_type = actual_element_type;
		meta.semantic_offset = semantic_offset;
		meta.start_row = start_row;
		meta.start_col = start_col;
		meta.lowering = broken_patch_variables && system_value == DXIL::Semantic::User;

		if (system_value != DXIL::Semantic::User)
		{
			emit_builtin_decoration(variable_id, system_value, storage);
		}
		else
		{
			// Patch constants are packed together with control point variables,
			// so we need to apply an offset to make this work in SPIR-V.
			// The offset is deduced from the control point I/O signature.
			// TODO: If it's possible to omit trailing CP members in domain shader, we will need to pass this offset
			// into the compiler.
			VulkanStageIO vk_io = { start_row + patch_location_offset, start_col, true };

			if (resource_mapping_iface)
			{
				D3DStageIO d3d_io = { semantic_name.c_str(), semantic_index, start_row, rows };

				if (execution_model == spv::ExecutionModelTessellationEvaluation)
				{
					if (!resource_mapping_iface->remap_stage_input(d3d_io, vk_io))
						return false;
				}
				else if (!resource_mapping_iface->remap_stage_output(d3d_io, vk_io))
					return false;
			}

			builder.addDecoration(variable_id, spv::DecorationLocation, vk_io.location);
			if (vk_io.component != 0)
				builder.addDecoration(variable_id, spv::DecorationComponent, vk_io.component);
		}

		builder.addDecoration(variable_id, execution_model == spv::ExecutionModelMeshEXT
		                                   ? spv::DecorationPerPrimitiveEXT : spv::DecorationPatch);
	}

	if (num_broken_user_rows)
	{
		spv::Id type_id = builder.makeArrayType(builder.makeVectorType(builder.makeUintType(32), 4),
		                                        builder.makeUintConstant(num_broken_user_rows), 0);
		execution_mode_meta.patch_lowering_array_var_id =
			create_variable_with_initializer(spv::StorageClassPrivate, type_id,
			                                 builder.makeNullConstant(type_id),
			                                 "PatchLoweringRows");
	}

	return true;
}